

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# happly.h
# Opt level: O3

vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> * __thiscall
happly::PLYData::getVertexPositions
          (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
           *__return_storage_ptr__,PLYData *this,string *vertexElementName)

{
  double *pdVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer paVar3;
  Element *pEVar4;
  unique_ptr<happly::Property,_std::default_delete<happly::Property>_> *puVar5;
  double *pdVar6;
  long lVar7;
  long lVar8;
  vector<double,_std::allocator<double>_> xPos;
  vector<double,_std::allocator<double>_> yPos;
  vector<double,_std::allocator<double>_> zPos;
  string local_90;
  vector<double,_std::allocator<double>_> local_70;
  vector<double,_std::allocator<double>_> local_58;
  vector<double,_std::allocator<double>_> local_40;
  
  pEVar4 = getElement(this,vertexElementName);
  paVar2 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"x","");
  puVar5 = Element::getPropertyPtr(pEVar4,&local_90);
  Element::getDataFromPropertyRecursive<double,double>
            (&local_70,pEVar4,
             (puVar5->_M_t).
             super___uniq_ptr_impl<happly::Property,_std::default_delete<happly::Property>_>._M_t.
             super__Tuple_impl<0UL,_happly::Property_*,_std::default_delete<happly::Property>_>.
             super__Head_base<0UL,_happly::Property_*,_false>._M_head_impl);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  pEVar4 = getElement(this,vertexElementName);
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"y","");
  puVar5 = Element::getPropertyPtr(pEVar4,&local_90);
  Element::getDataFromPropertyRecursive<double,double>
            (&local_58,pEVar4,
             (puVar5->_M_t).
             super___uniq_ptr_impl<happly::Property,_std::default_delete<happly::Property>_>._M_t.
             super__Tuple_impl<0UL,_happly::Property_*,_std::default_delete<happly::Property>_>.
             super__Head_base<0UL,_happly::Property_*,_false>._M_head_impl);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  pEVar4 = getElement(this,vertexElementName);
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"z","");
  puVar5 = Element::getPropertyPtr(pEVar4,&local_90);
  Element::getDataFromPropertyRecursive<double,double>
            (&local_40,pEVar4,
             (puVar5->_M_t).
             super___uniq_ptr_impl<happly::Property,_std::default_delete<happly::Property>_>._M_t.
             super__Tuple_impl<0UL,_happly::Property_*,_std::default_delete<happly::Property>_>.
             super__Head_base<0UL,_happly::Property_*,_false>._M_head_impl);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  geometrycentral::surface::std::
  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::vector
            (__return_storage_ptr__,
             (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_90);
  paVar3 = (__return_storage_ptr__->
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)(__return_storage_ptr__->
                super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)paVar3;
  if (lVar7 == 0) {
    if (local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start == (pointer)0x0) goto LAB_0017bc90;
  }
  else {
    lVar7 = (lVar7 >> 3) * -0x5555555555555555;
    pdVar6 = paVar3->_M_elems + 2;
    lVar8 = 0;
    do {
      ((array<double,_3UL> *)(pdVar6 + -2))->_M_elems[0] =
           local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar8];
      pdVar6[-1] = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar8];
      pdVar1 = local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + lVar8;
      lVar8 = lVar8 + 1;
      *pdVar6 = *pdVar1;
      pdVar6 = pdVar6 + 3;
    } while (lVar7 + (ulong)(lVar7 == 0) != lVar8);
  }
  operator_delete(local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start);
LAB_0017bc90:
  if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::array<double, 3>> getVertexPositions(const std::string& vertexElementName = "vertex") {

    std::vector<double> xPos = getElement(vertexElementName).getProperty<double>("x");
    std::vector<double> yPos = getElement(vertexElementName).getProperty<double>("y");
    std::vector<double> zPos = getElement(vertexElementName).getProperty<double>("z");

    std::vector<std::array<double, 3>> result(xPos.size());
    for (size_t i = 0; i < result.size(); i++) {
      result[i][0] = xPos[i];
      result[i][1] = yPos[i];
      result[i][2] = zPos[i];
    }

    return result;
  }